

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O0

int __thiscall TCPController::poll(TCPController *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  ushort uVar2;
  short sVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  undefined1 local_78 [8];
  mapped_type conn;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false> local_50;
  undefined1 local_48 [8];
  shared_lock<std::shared_mutex> lock;
  pollfd pfd;
  int local_28;
  int i;
  int total_polls;
  int timeout_local;
  nfds_t nfds_local;
  pollfd *fds_local;
  TCPController *this_local;
  
  local_28 = 0;
  do {
    pfd.events = 0;
    pfd.revents = 0;
    for (; (ulong)(long)(int)pfd._4_4_ < __nfds; pfd._4_4_ = pfd._4_4_ + 1) {
      lock._8_8_ = __fds[(int)pfd._4_4_];
      std::shared_lock<std::shared_mutex>::shared_lock
                ((shared_lock<std::shared_mutex> *)local_48,&this->mutex_);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
           ::find(&this->connections,(key_type *)&lock._M_owns);
      conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
           ::end(&this->connections);
      bVar1 = std::__detail::operator!=
                        (&local_50,
                         (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>
                          *)&conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      if (bVar1) {
        pmVar4 = std::
                 unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
                 ::operator[](&this->connections,(key_type *)&lock._M_owns);
        std::shared_ptr<TCPConnection>::shared_ptr((shared_ptr<TCPConnection> *)local_78,pmVar4);
        std::shared_lock<std::shared_mutex>::unlock((shared_lock<std::shared_mutex> *)local_48);
        peVar5 = std::__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
        uVar2 = TCPConnection::hasRead(peVar5);
        if ((uVar2 & lock._12_2_) != 0) {
          peVar5 = std::__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
          sVar3 = TCPConnection::hasRead(peVar5);
          __fds[(int)pfd._4_4_].revents = sVar3;
          local_28 = local_28 + 1;
        }
        std::shared_ptr<TCPConnection>::~shared_ptr((shared_ptr<TCPConnection> *)local_78);
      }
      std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_48);
    }
  } while (local_28 < 1);
  return local_28;
}

Assistant:

int TCPController::poll(struct pollfd *fds, nfds_t nfds, int timeout) {
    int total_polls = 0;
    while (true) {
        for (int i = 0; i < nfds; i++) {
            struct pollfd pfd = fds[i];
            std::shared_lock lock(mutex_);
            if (connections.find(pfd.fd) != connections.end()) {
//                std::cout << "query on fd " << pfd.fd << "for event " << pfd.events << std::endl;
                auto conn = connections[pfd.fd];
                lock.unlock();
//                short flags = 0;
//                if (conn->hasRead()) {
//                    flags |= (POLLRDNORM | POLLRDBAND | POLLIN | POLLPRI);
//                }
//                flags |= (POLLOUT | POLLWRNORM | POLLWRBAND);
                if ((conn->hasRead() & pfd.events) != 0) {
//                    std::cout << "return on fd " << pfd.fd << "for event " << conn->hasRead() << std::endl;
                    fds[i].revents = conn->hasRead();
                    total_polls++;
                }
            }
        }
        if (total_polls > 0) {
            break;
        }

    }
    return total_polls;
}